

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way_parallel<false,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  size_t __n;
  uchar uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uchar *puVar4;
  int iVar5;
  MergeResult MVar6;
  ostream *poVar7;
  uchar **ppuVar8;
  uchar *puVar9;
  uint uVar10;
  lcp_t lVar11;
  lcp_t *plVar12;
  uchar **ppuVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  size_t sVar18;
  uchar uVar19;
  ptrdiff_t _Num;
  ulong uVar20;
  MergeResult local_90;
  char local_89;
  lcp_t *local_88;
  size_t local_80;
  uchar **local_78;
  uchar *local_70;
  uchar **local_68;
  lcp_t *local_60;
  uchar *local_58;
  uchar *local_50;
  lcp_t *local_48;
  uchar *local_40;
  uchar **local_38;
  
  local_88 = lcp_output;
  local_78 = strings_output;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"mergesort_cache_lcp_2way_parallel",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(): n=",6);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_89,1);
  ppuVar8 = local_78;
  if (n < 0x20) {
    if (1 < n) {
      uVar20 = n & 0xffffffff;
      ppuVar8 = strings_input;
      do {
        pbVar2 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar13 = ppuVar8; strings_input < ppuVar13; ppuVar13 = ppuVar13 + -1) {
          pbVar3 = ppuVar13[-1];
          bVar15 = *pbVar3;
          bVar16 = *pbVar2;
          if (bVar15 != 0 && bVar15 == bVar16) {
            lVar17 = 1;
            do {
              bVar15 = pbVar3[lVar17];
              bVar16 = pbVar2[lVar17];
              if (bVar15 == 0) break;
              lVar17 = lVar17 + 1;
            } while (bVar15 == bVar16);
          }
          if (bVar15 <= bVar16) break;
          *ppuVar13 = pbVar3;
        }
        iVar5 = (int)uVar20;
        *ppuVar13 = pbVar2;
        uVar20 = (ulong)(iVar5 - 1);
      } while (2 < iVar5);
    }
    puVar9 = strings_input[1];
    lVar11 = 0;
    uVar19 = **strings_input;
    uVar1 = uVar19;
    while ((uVar1 != '\0' && (uVar1 == puVar9[lVar11]))) {
      lVar17 = lVar11 + 1;
      lVar11 = lVar11 + 1;
      uVar1 = (*strings_input)[lVar17];
    }
    *lcp_input = lVar11;
    *cache_input = uVar19;
    if (1 < n - 1) {
      uVar20 = 1;
      uVar10 = 1;
      do {
        uVar14 = (ulong)(uVar10 + 1);
        puVar4 = strings_input[uVar14];
        lVar11 = 0;
        uVar19 = *puVar9;
        while ((uVar19 != '\0' && (uVar19 == puVar4[lVar11]))) {
          lVar17 = lVar11 + 1;
          lVar11 = lVar11 + 1;
          uVar19 = puVar9[lVar17];
        }
        lcp_input[uVar20] = lVar11;
        cache_input[uVar20] = puVar9[lcp_input[uVar10 - 1]];
        puVar9 = puVar4;
        uVar20 = uVar14;
        uVar10 = uVar10 + 1;
      } while (uVar14 < n - 1);
    }
    if (strings_input[n - 1] != (uchar *)0x0) {
      cache_input[n - 1] = strings_input[n - 1][lcp_input[n - 2]];
      check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                  ,0x26,"unsigned char get_char(unsigned char *, size_t)");
  }
  uVar20 = n >> 1;
  MVar6 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                    (strings_input,local_78,lcp_input,local_88,cache_input,cache_output,uVar20);
  local_58 = cache_input + uVar20;
  local_40 = cache_output + uVar20;
  local_80 = n - uVar20;
  local_68 = strings_input + uVar20;
  ppuVar13 = ppuVar8 + uVar20;
  local_60 = lcp_input + uVar20;
  local_48 = local_88 + uVar20;
  local_70 = cache_output;
  local_50 = cache_input;
  local_38 = ppuVar13;
  if (MVar6 == SortedInPlace) {
    check_input<unsigned_char>(strings_input,lcp_input,cache_input,uVar20);
    puVar9 = local_58;
    sVar18 = local_80;
    local_90 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                         (local_68,ppuVar13,local_60,local_48,local_58,local_40,local_80);
    check_input<unsigned_char>(local_68,local_60,puVar9,sVar18);
    if (local_90 == SortedInPlace) {
      merge_cache_lcp_2way<false,unsigned_char>
                (strings_input,lcp_input,local_50,uVar20,local_68,local_60,local_58,local_80,
                 local_78,local_88,local_70);
      return SortedInTemp;
    }
  }
  else {
    check_input<unsigned_char>(ppuVar8,local_88,cache_output,uVar20);
    puVar9 = local_40;
    plVar12 = local_48;
    local_90 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                         (local_68,ppuVar13,local_60,local_48,local_58,local_40,local_80);
    sVar18 = local_80;
    check_input<unsigned_char>(ppuVar13,plVar12,puVar9,local_80);
    plVar12 = local_88;
    puVar9 = local_50;
    if (MVar6 == local_90) goto LAB_0024c2b9;
  }
  puVar9 = local_50;
  plVar12 = local_88;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"Warning: extra copying due to m0 != m1. n=",0x2a);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  __n = uVar20 * 8;
  if (MVar6 == SortedInPlace) {
    memmove(local_78,strings_input,__n);
    memcpy(local_70,puVar9,uVar20);
    memcpy(plVar12,lcp_input,__n);
    MVar6 = SortedInTemp;
  }
  else {
    memmove(strings_input,local_78,__n);
    memcpy(puVar9,local_70,uVar20);
    memcpy(lcp_input,plVar12,__n);
    local_90 = SortedInTemp;
  }
  sVar18 = local_80;
  if (MVar6 != local_90) {
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x5e2,
                  "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned char]"
                 );
  }
LAB_0024c2b9:
  merge_cache_lcp_2way<false,unsigned_char>
            (local_78,plVar12,local_70,uVar20,local_38,local_48,local_40,sVar18,strings_input,
             lcp_input,puVar9);
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}